

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

void __thiscall Clasp::ShortImplicationsGraph::resize(ShortImplicationsGraph *this,uint32 nodes)

{
  size_type sVar1;
  pointer pIVar2;
  size_type i;
  uint uVar3;
  ebo local_68;
  ImplicationList local_58;
  
  uVar3 = (this->graph_).ebo_.size;
  if (uVar3 < nodes) {
    if ((this->graph_).ebo_.cap < nodes) {
      local_68.buf = (pointer)0x0;
      local_68.size = 0;
      local_68.cap = 0;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
           &local_58.super_ImpListBase.super_type.
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
            field_0x14;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>._8_4_ = 0x20;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ = 0;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = 0x20
      ;
      uVar3 = 0;
      LOCK();
      local_58.learnt._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::resize((pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
                *)&local_68,nodes,&local_58);
      ImplicationList::~ImplicationList(&local_58);
      for (; uVar3 != (this->graph_).ebo_.size; uVar3 = uVar3 + 1) {
        ImplicationList::move(local_68.buf + uVar3,(this->graph_).ebo_.buf + uVar3);
      }
      pIVar2 = (this->graph_).ebo_.buf;
      (this->graph_).ebo_.buf = local_68.buf;
      sVar1 = (this->graph_).ebo_.cap;
      (this->graph_).ebo_.size = local_68.size;
      (this->graph_).ebo_.cap = local_68.cap;
      local_68.cap = sVar1;
      local_68.size = uVar3;
      local_68.buf = pIVar2;
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::ebo::~ebo(&local_68);
    }
    else {
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.buf_ =
           &local_58.super_ImpListBase.super_type.
            super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
            field_0x14;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>._8_4_ = 0x20;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.left_ = 0;
      local_58.super_ImpListBase.super_type.
      super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.right_ = 0x20
      ;
      LOCK();
      local_58.learnt._M_b._M_p = (__base_type)(__pointer_type)0x0;
      UNLOCK();
      bk_lib::
      pod_vector<Clasp::ShortImplicationsGraph::ImplicationList,_std::allocator<Clasp::ShortImplicationsGraph::ImplicationList>_>
      ::resize(&this->graph_,nodes,&local_58);
      ImplicationList::~ImplicationList(&local_58);
    }
  }
  else {
    while (uVar3 != nodes) {
      ImplicationList::clear((this->graph_).ebo_.buf + (uVar3 - 1),true);
      uVar3 = (this->graph_).ebo_.size - 1;
      (this->graph_).ebo_.size = uVar3;
    }
  }
  return;
}

Assistant:

void ShortImplicationsGraph::resize(uint32 nodes) {
	if (nodes <= graph_.size()) {
		while (graph_.size() != nodes) {
			graph_.back().clear(true);
			graph_.pop_back();
		}
	}
	else if (graph_.capacity() >= nodes) {
		graph_.resize(nodes);
	}
	else {
		ImpLists temp; temp.resize(nodes);
		for (ImpLists::size_type i = 0; i != graph_.size(); ++i) {
			temp[i].move(graph_[i]);
		}
		graph_.swap(temp);
	}
}